

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::ConstructorOp::ConstructorOp
          (ConstructorOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ConstValueRangeAccess valueRange_02;
  ConstValueRangeAccess valueRange_03;
  ConstValueRangeAccess other;
  ConstValueRangeAccess src;
  ValueRangeAccess dst;
  GeneratorState *state_00;
  bool bVar1;
  Type dstType;
  int iVar2;
  VariableType *pVVar3;
  ProgramParameters *pPVar4;
  long lVar5;
  Random *this_00;
  Scalar *in_stack_fffffffffffffbe8;
  ValueRange local_380;
  ValueRangeAccess local_300;
  VariableType *local_2e8;
  VariableType *pVStack_2e0;
  Scalar *local_2d8;
  VariableType local_2d0;
  undefined1 local_280 [8];
  ValueRange inValueRange;
  Type inType;
  Type local_1a0 [2];
  Type inTypes [3];
  int numInTypes;
  ValueRangeAccess local_178;
  VariableType *pVStack_160;
  ConstValueRangeAccess comp;
  bool scalarConversions;
  int curScalarNdx;
  int numScalars;
  Type baseType;
  VariableType *type;
  Scalar *pSStack_128;
  Scalar *local_120;
  VariableType local_118;
  ValueRange local_c8;
  undefined4 local_48;
  int maxScalars;
  VariableType *local_38;
  Scalar *pSStack_30;
  Scalar *local_28;
  GeneratorState *local_18;
  GeneratorState *state_local;
  ConstructorOp *this_local;
  
  local_18 = state;
  state_local = (GeneratorState *)this;
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_00cbe328;
  local_28 = valueRange.m_max;
  local_38 = valueRange.m_type;
  pSStack_30 = valueRange.m_min;
  ValueRange::ValueRange(&this->m_valueRange,valueRange);
  ValueStorage<64>::ValueStorage(&this->m_value);
  std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::vector(&this->m_inputValueRanges);
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::vector
            (&this->m_inputExpressions);
  pVVar3 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar3);
  if (bVar1) {
    local_48 = 4;
    computeRandomType(&local_118,local_18,4);
    ValueRange::ValueRange(&local_c8,&local_118);
    ValueRange::operator=(&this->m_valueRange,&local_c8);
    ValueRange::~ValueRange(&local_c8);
    VariableType::~VariableType(&local_118);
    state_00 = local_18;
    ValueRange::asAccess((ValueRangeAccess *)&type,&this->m_valueRange);
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_128;
    valueRange_00.super_ConstValueRangeAccess.m_type = type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_120;
    computeRandomValueRange(state_00,valueRange_00);
  }
  pVVar3 = ValueRange::getType(&this->m_valueRange);
  dstType = VariableType::getBaseType(pVVar3);
  iVar2 = VariableType::getNumElements(pVVar3);
  comp.m_max._4_4_ = 0;
  pPVar4 = GeneratorState::getProgramParameters(local_18);
  comp.m_max._3_1_ = pPVar4->useScalarConversions & 1;
  while (comp.m_max._4_4_ < iVar2) {
    ValueRange::asAccess((ValueRangeAccess *)(inTypes + 2),&this->m_valueRange);
    ValueRangeAccess::component(&local_178,(ValueRangeAccess *)(inTypes + 2),comp.m_max._4_4_);
    pVStack_160 = local_178.super_ConstValueRangeAccess.m_type;
    comp.m_type = (VariableType *)local_178.super_ConstValueRangeAccess.m_min;
    comp.m_min = local_178.super_ConstValueRangeAccess.m_max;
    if ((comp.m_max._3_1_ & 1) == 0) {
      in_stack_fffffffffffffbe8 = (Scalar *)&this->m_inputValueRanges;
      other.m_min = local_178.super_ConstValueRangeAccess.m_min;
      other.m_type = local_178.super_ConstValueRangeAccess.m_type;
      other.m_max = local_178.super_ConstValueRangeAccess.m_max;
      ValueRange::ValueRange(&local_380,other);
      std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::push_back
                ((vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_> *)
                 in_stack_fffffffffffffbe8,&local_380);
      ValueRange::~ValueRange(&local_380);
      comp.m_max._4_4_ = comp.m_max._4_4_ + 1;
    }
    else {
      inTypes[1] = TYPE_VOID;
      valueRange_01.m_min = local_178.super_ConstValueRangeAccess.m_min;
      valueRange_01.m_type = local_178.super_ConstValueRangeAccess.m_type;
      valueRange_01.m_max = local_178.super_ConstValueRangeAccess.m_max;
      bVar1 = anon_unknown_0::isConversionOk(TYPE_FLOAT,dstType,valueRange_01);
      if (bVar1) {
        lVar5 = (long)(int)inTypes[1];
        inTypes[1] = inTypes[1] + TYPE_FLOAT;
        inTypes[lVar5 + -2] = TYPE_FLOAT;
      }
      valueRange_02.m_min = (Scalar *)comp.m_type;
      valueRange_02.m_type = pVStack_160;
      valueRange_02.m_max = comp.m_min;
      bVar1 = anon_unknown_0::isConversionOk(TYPE_INT,dstType,valueRange_02);
      if (bVar1) {
        lVar5 = (long)(int)inTypes[1];
        inTypes[1] = inTypes[1] + TYPE_FLOAT;
        inTypes[lVar5 + -2] = TYPE_INT;
      }
      valueRange_03.m_min = (Scalar *)comp.m_type;
      valueRange_03.m_type = pVStack_160;
      valueRange_03.m_max = comp.m_min;
      bVar1 = anon_unknown_0::isConversionOk(TYPE_BOOL,dstType,valueRange_03);
      if (bVar1) {
        lVar5 = (long)(int)inTypes[1];
        inTypes[1] = inTypes[1] + TYPE_FLOAT;
        inTypes[lVar5 + -2] = TYPE_BOOL;
      }
      this_00 = GeneratorState::getRandom(local_18);
      inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           de::Random::choose<rsg::VariableType::Type,rsg::VariableType::Type*>
                     (this_00,local_1a0,inTypes + (long)(int)inTypes[1] + -2);
      VariableType::VariableType
                (&local_2d0,
                 inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
      ValueRange::ValueRange((ValueRange *)local_280,&local_2d0);
      VariableType::~VariableType(&local_2d0);
      local_2d8 = comp.m_min;
      local_2e8 = pVStack_160;
      pVStack_2e0 = comp.m_type;
      ValueRange::operator_cast_to_ValueRangeAccess(&local_300,(ValueRange *)local_280);
      src.m_min = local_2d8;
      src.m_type = pVStack_2e0;
      src.m_max = (Scalar *)local_300.super_ConstValueRangeAccess.m_type;
      dst.super_ConstValueRangeAccess.m_min = local_300.super_ConstValueRangeAccess.m_max;
      dst.super_ConstValueRangeAccess.m_type =
           (VariableType *)local_300.super_ConstValueRangeAccess.m_min;
      dst.super_ConstValueRangeAccess.m_max = in_stack_fffffffffffffbe8;
      anon_unknown_0::convertValueRange(src,dst);
      std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::push_back
                (&this->m_inputValueRanges,(value_type *)local_280);
      comp.m_max._4_4_ = comp.m_max._4_4_ + 1;
      ValueRange::~ValueRange((ValueRange *)local_280);
    }
  }
  return;
}

Assistant:

ConstructorOp::ConstructorOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange(valueRange)
{
	if (valueRange.getType().isVoid())
	{
		// Use random range
		const int maxScalars = 4; // We don't have to be able to assign this value to anywhere
		m_valueRange = ValueRange(computeRandomType(state, maxScalars));
		computeRandomValueRange(state, m_valueRange.asAccess());
	}

	// \todo [2011-03-26 pyry] Vector conversions
//	int						remainingDepth	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();

	const VariableType&		type			= m_valueRange.getType();
	VariableType::Type		baseType		= type.getBaseType();
	int						numScalars		= type.getNumElements();
	int						curScalarNdx	= 0;

	// \todo [2011-03-26 pyry] Separate op for struct constructors!
	DE_ASSERT(type.isFloatOrVec() || type.isIntOrVec() || type.isBoolOrVec());

	bool scalarConversions = state.getProgramParameters().useScalarConversions;

	while (curScalarNdx < numScalars)
	{
		ConstValueRangeAccess comp = m_valueRange.asAccess().component(curScalarNdx);

		if (scalarConversions)
		{
			int					numInTypes = 0;
			VariableType::Type	inTypes[3];

			if (isConversionOk(VariableType::TYPE_FLOAT, baseType, comp))	inTypes[numInTypes++] = VariableType::TYPE_FLOAT;
			if (isConversionOk(VariableType::TYPE_INT, baseType, comp))		inTypes[numInTypes++] = VariableType::TYPE_INT;
			if (isConversionOk(VariableType::TYPE_BOOL, baseType, comp))	inTypes[numInTypes++] = VariableType::TYPE_BOOL;

			DE_ASSERT(numInTypes > 0); // At least nop conversion should be ok

			// Choose random
			VariableType::Type inType = state.getRandom().choose<VariableType::Type>(&inTypes[0], &inTypes[0] + numInTypes);

			// Compute converted value range
			ValueRange inValueRange(VariableType(inType, 1));
			convertValueRange(comp, inValueRange);
			m_inputValueRanges.push_back(inValueRange);

			curScalarNdx += 1;
		}
		else
		{
			m_inputValueRanges.push_back(ValueRange(comp));
			curScalarNdx += 1;
		}
	}
}